

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void __thiscall ObjectBlockPool<256,_256>::~ObjectBlockPool(ObjectBlockPool<256,_256> *this)

{
  Reset(this);
  if ((this->objectsToFree).data != (SmallBlock<256> **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->objectsToFinalize).data != (SmallBlock<256> **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->sortedPages).data != (LargeBlock<256,_256> **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  return;
}

Assistant:

~ObjectBlockPool()
	{
		Reset();
	}